

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

TPM_RC TSS_HMAC(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT handle,BYTE *data,
               UINT32 dataSize,TPM2B_DIGEST *outHMAC)

{
  undefined4 in_EAX;
  int iVar1;
  TPM_RC TVar2;
  LOGGER_LOG p_Var3;
  undefined1 auVar4 [16];
  TPM2B_MAX_BUFFER dataBuf;
  
  if (dataSize < 0x401) {
    auVar4._0_4_ = -(uint)(tpm == (TSS_DEVICE *)0x0);
    auVar4._4_4_ = -(uint)(session == (TSS_SESSION *)0x0);
    auVar4._8_4_ = -(uint)(data == (BYTE *)0x0);
    auVar4._12_4_ = -(uint)(outHMAC == (TPM2B_DIGEST *)0x0);
    iVar1 = movmskps(in_EAX,auVar4);
    if (iVar1 == 0) {
      dataBuf.t.size = (UINT16)dataSize;
      MemoryCopy(dataBuf.t.buffer,data,dataSize);
      TVar2 = TPM2_HMAC(tpm,session,handle,&dataBuf,0x10,outHMAC);
    }
    else {
      p_Var3 = xlogging_get_log_function();
      TVar2 = 0x101;
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                  ,"TSS_HMAC",0x1b5,1,
                  "Invalid parameter specified tpm: %p, session: %p, data: %p, outHMAC: %p",tpm,
                  session,data,outHMAC);
      }
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    TVar2 = 0x95;
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TSS_HMAC",0x1b0,1,"Invalid data size specified %u",(ulong)dataSize);
    }
  }
  return TVar2;
}

Assistant:

TPM_RC TSS_HMAC(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          handle,             // IN
    BYTE                   *data,               // IN
    UINT32                  dataSize,           // IN
    TPM2B_DIGEST           *outHMAC             // OUT
)
{
    TPM_RC result;
    if (dataSize > MAX_DIGEST_BUFFER)
    {
        LogError("Invalid data size specified %u", dataSize);
        result = TPM_RC_SIZE;
    }
    else if (tpm == NULL || session == NULL || data == NULL || outHMAC == NULL)
    {
        LogError("Invalid parameter specified tpm: %p, session: %p, data: %p, outHMAC: %p", tpm, session, data, outHMAC);
        result = TPM_RC_FAILURE;
    }
    else
    {
        TPM2B_MAX_BUFFER    dataBuf;
        dataBuf.b.size = (UINT16)dataSize;
        MemoryCopy(dataBuf.t.buffer, data, dataSize);
        result = TPM2_HMAC(tpm, session, handle, &dataBuf, TPM_ALG_NULL, outHMAC);
    }
    return result;
}